

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_update_dims_from_array(nifti_image *nim)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (nim == (nifti_image *)0x0) {
    fwrite("** update_dims: missing nim\n",0x1c,1,_stderr);
  }
  else {
    if (2 < g_opts_0) {
      fwrite("+d updating image dimensions given nim->dim:",0x2c,1,_stderr);
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        fprintf(_stderr," %d",(ulong)(uint)nim->dim[lVar7]);
      }
      fputc(10,_stderr);
    }
    uVar1 = nim->dim[0];
    uVar2 = (ulong)uVar1;
    if (0xfffffff8 < uVar1 - 8) {
      iVar3 = nim->dim[1];
      if (iVar3 < 1) {
        nim->dim[1] = 1;
        iVar3 = 1;
      }
      nim->nx = iVar3;
      nim->dx = nim->pixdim[1];
      if ((uVar1 < 2) || (iVar3 = nim->dim[2], iVar3 < 1)) {
        nim->dim[2] = 1;
        iVar3 = 1;
      }
      nim->ny = iVar3;
      nim->dy = nim->pixdim[2];
      if ((uVar1 < 3) || (iVar3 = nim->dim[3], iVar3 < 1)) {
        nim->dim[3] = 1;
        iVar3 = 1;
      }
      nim->nz = iVar3;
      nim->dz = nim->pixdim[3];
      if ((uVar1 < 4) || (iVar3 = nim->dim[4], iVar3 < 1)) {
        nim->dim[4] = 1;
        iVar3 = 1;
      }
      nim->nt = iVar3;
      nim->dt = nim->pixdim[4];
      if ((uVar1 < 5) || (iVar3 = nim->dim[5], iVar3 < 1)) {
        nim->dim[5] = 1;
        iVar3 = 1;
      }
      nim->nu = iVar3;
      nim->du = nim->pixdim[5];
      if ((uVar1 < 6) || (iVar3 = nim->dim[6], iVar3 < 1)) {
        nim->dim[6] = 1;
        iVar3 = 1;
      }
      nim->nv = iVar3;
      nim->dv = nim->pixdim[6];
      if ((uVar1 < 7) || (iVar3 = nim->dim[7], nim->dim[7] < 1)) {
        nim->dim[7] = 1;
        iVar3 = 1;
      }
      nim->nw = iVar3;
      nim->dw = nim->pixdim[7];
      nim->nvox = 1;
      sVar4 = 1;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        sVar4 = sVar4 * (long)nim->dim[uVar5 + 1];
        nim->nvox = sVar4;
      }
      uVar5 = 1;
      if ((int)uVar1 < 1) {
        uVar5 = (ulong)uVar1;
      }
      for (; (uVar6 = uVar5, 1 < (int)uVar2 && (uVar6 = uVar2, nim->dim[uVar2] < 2));
          uVar2 = (ulong)((int)uVar2 - 1)) {
      }
      if (2 < g_opts_0) {
        fprintf(_stderr,"+d ndim = %d -> %d\n",(ulong)(uint)nim->ndim,uVar6);
        fprintf(_stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",(ulong)(uint)nim->nx,(ulong)(uint)nim->ny,
                (ulong)(uint)nim->nz,(ulong)(uint)nim->nt,(ulong)(uint)nim->nu,(ulong)(uint)nim->nv,
                (ulong)(uint)nim->nw);
      }
      nim->ndim = (int)uVar6;
      nim->dim[0] = (int)uVar6;
      return 0;
    }
    fwrite("** invalid dim[0], dim[] = ",0x1b,1,_stderr);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      fprintf(_stderr," %d",(ulong)(uint)nim->dim[lVar7]);
    }
    fputc(10,_stderr);
  }
  return 1;
}

Assistant:

int nifti_update_dims_from_array( nifti_image * nim )
{
   int c, ndim;

   if( !nim ){
      fprintf(stderr,"** update_dims: missing nim\n");
      return 1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d updating image dimensions given nim->dim:");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
   }

   /* verify dim[0] first */
   if(nim->dim[0] < 1 || nim->dim[0] > 7){
      fprintf(stderr,"** invalid dim[0], dim[] = ");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
      return 1;
   }

   /* set nx, ny ..., dx, dy, ..., one by one */

   /* less than 1, set to 1, else copy */
   if(nim->dim[1] < 1) nim->nx = nim->dim[1] = 1;
   else                nim->nx = nim->dim[1];
   nim->dx = nim->pixdim[1];

   /* if undefined, or less than 1, set to 1 */
   if(nim->dim[0] < 2 || (nim->dim[0] >= 2 && nim->dim[2] < 1))
      nim->ny = nim->dim[2] = 1;
   else
      nim->ny = nim->dim[2];
   /* copy delta values, in any case */
   nim->dy = nim->pixdim[2];

   if(nim->dim[0] < 3 || (nim->dim[0] >= 3 && nim->dim[3] < 1))
      nim->nz = nim->dim[3] = 1;
   else /* just copy vals from arrays */
      nim->nz = nim->dim[3];
   nim->dz = nim->pixdim[3];

   if(nim->dim[0] < 4 || (nim->dim[0] >= 4 && nim->dim[4] < 1))
      nim->nt = nim->dim[4] = 1;
   else /* just copy vals from arrays */
      nim->nt = nim->dim[4];
   nim->dt = nim->pixdim[4];

   if(nim->dim[0] < 5 || (nim->dim[0] >= 5 && nim->dim[5] < 1))
      nim->nu = nim->dim[5] = 1;
   else /* just copy vals from arrays */
      nim->nu = nim->dim[5];
   nim->du = nim->pixdim[5];

   if(nim->dim[0] < 6 || (nim->dim[0] >= 6 && nim->dim[6] < 1))
      nim->nv = nim->dim[6] = 1;
   else /* just copy vals from arrays */
      nim->nv = nim->dim[6];
   nim->dv = nim->pixdim[6];

   if(nim->dim[0] < 7 || (nim->dim[0] >= 7 && nim->dim[7] < 1))
      nim->nw = nim->dim[7] = 1;
   else /* just copy vals from arrays */
      nim->nw = nim->dim[7];
   nim->dw = nim->pixdim[7];

   for( c = 1, nim->nvox = 1; c <= nim->dim[0]; c++ )
      nim->nvox *= nim->dim[c];

   /* compute ndim, assuming it can be no larger than the old one */
   for( ndim = nim->dim[0]; (ndim > 1) && (nim->dim[ndim] <= 1); ndim-- )
       ;

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d ndim = %d -> %d\n",nim->ndim, ndim);
      fprintf(stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",
              nim->nx, nim->ny, nim->nz, nim->nt, nim->nu, nim->nv, nim->nw);
   }

   nim->dim[0] = nim->ndim = ndim;

   return 0;
}